

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

TEdge * ClipperLib::RemoveEdge(TEdge *e)

{
  TEdge *result;
  TEdge *e_local;
  
  e->Prev->Next = e->Next;
  e->Next->Prev = e->Prev;
  e->Prev = (TEdge *)0x0;
  return e->Next;
}

Assistant:

TEdge* RemoveEdge(TEdge* e)
{
  //removes e from double_linked_list (but without removing from memory)
  e->Prev->Next = e->Next;
  e->Next->Prev = e->Prev;
  TEdge* result = e->Next;
  e->Prev = 0; //flag as removed (see ClipperBase.Clear)
  return result;
}